

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

size_t __thiscall
gmlc::utilities::base64_decode
          (utilities *this,string_view encoded_string,void *data,size_t max_size)

{
  void *pvVar1;
  utilities uVar2;
  char cVar3;
  byte bVar4;
  undefined8 uVar5;
  byte bVar6;
  uint uVar7;
  ulong in_RAX;
  char cVar8;
  ulong uVar9;
  byte bVar10;
  char *pcVar11;
  uint uVar12;
  utilities *puVar13;
  void *pvVar14;
  long lVar15;
  void *pvVar16;
  array<unsigned_char,_3UL> char_array_3;
  array<unsigned_char,_4UL> char_array_4;
  undefined8 local_28;
  
  pcVar11 = encoded_string._M_str;
  local_28 = in_RAX & 0xffffffffff000000;
  local_28 = (local_28 >> 0x10 & 0xffff) << 0x10;
  uVar9 = local_28;
  if (this == (utilities *)0x0) {
    bVar6 = 0;
    uVar12 = 0;
    pvVar16 = (void *)0x0;
  }
  else {
    local_28._1_1_ = 0;
    local_28._2_1_ = '\0';
    puVar13 = (utilities *)0x0;
    pvVar16 = (void *)0x0;
    uVar12 = 0;
    bVar6 = 0;
    cVar8 = local_28._2_1_;
    bVar10 = local_28._1_1_;
    local_28 = uVar9;
    do {
      uVar9 = local_28;
      uVar2 = puVar13[encoded_string._M_len];
      if (((ulong)(byte)uVar2 == 0x3d) ||
         (*(char *)((long)&std::__ioinit + (ulong)(byte)uVar2 + 1) == -1)) break;
      lVar15 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      *(utilities *)((long)&local_28 + lVar15 + 4) = uVar2;
      if (uVar12 == 4) {
        cVar3 = *(char *)((long)&std::__ioinit + (local_28 >> 0x20 & 0xff) + 1);
        local_28._0_5_ = CONCAT14(cVar3,(undefined4)local_28);
        bVar10 = *(byte *)((long)&std::__ioinit + (uVar9 >> 0x28 & 0xff) + 1);
        local_28._0_6_ = CONCAT15(bVar10,(undefined5)local_28);
        bVar4 = *(byte *)((long)&std::__ioinit + (uVar9 >> 0x30 & 0xff) + 1);
        local_28._0_7_ = CONCAT16(bVar4,(undefined6)local_28);
        cVar8 = *(char *)((long)&std::__ioinit + (uVar9 >> 0x38) + 1);
        local_28 = CONCAT17(cVar8,(undefined7)local_28);
        bVar6 = bVar10 >> 4 & 3 | cVar3 << 2;
        bVar10 = bVar4 >> 2 & 0xf | bVar10 << 4;
        cVar8 = bVar4 * '@' + cVar8;
        if ((void *)((long)pvVar16 + 2U) < data) {
          pcVar11[(long)pvVar16] = bVar6;
          (pcVar11 + 1)[(long)pvVar16] = bVar10;
          (pcVar11 + 2)[(long)pvVar16] = cVar8;
          pvVar16 = (void *)((long)pvVar16 + 3);
          uVar12 = 0;
        }
        else {
          pvVar1 = (void *)((long)pvVar16 + 1);
          if (pvVar1 < data) {
            pcVar11[(long)pvVar16] = bVar6;
            pvVar14 = (void *)((long)pvVar16 + 2U);
            pvVar16 = pvVar1;
            bVar6 = bVar10;
LAB_00400ca8:
            pcVar11[(long)pvVar16] = bVar6;
            return (size_t)pvVar14;
          }
          uVar12 = 0;
          pvVar14 = pvVar1;
          if (pvVar16 < data) goto LAB_00400ca8;
        }
      }
      puVar13 = puVar13 + 1;
    } while (this != puVar13);
    local_28 = (ulong)CONCAT52(local_28._3_5_,CONCAT11(cVar8,bVar10)) << 8;
  }
  local_28 = CONCAT71(local_28._1_7_,bVar6);
  if (0 < (int)uVar12) {
    if ((int)uVar12 < 4) {
      memset((void *)((long)&local_28 + (ulong)uVar12 + 4),0,(ulong)(3 - uVar12) + 1);
    }
    uVar9 = local_28;
    cVar8 = *(char *)((long)&std::__ioinit + (local_28 >> 0x20 & 0xff) + 1);
    local_28._0_5_ = CONCAT14(cVar8,(undefined4)local_28);
    bVar6 = *(byte *)((long)&std::__ioinit + (uVar9 >> 0x28 & 0xff) + 1);
    local_28._0_6_ = CONCAT15(bVar6,(undefined5)local_28);
    bVar10 = *(byte *)((long)&std::__ioinit + (uVar9 >> 0x30 & 0xff) + 1);
    local_28._0_7_ = CONCAT16(bVar10,(undefined6)local_28);
    cVar3 = *(char *)((long)&std::__ioinit + (uVar9 >> 0x38) + 1);
    local_28 = CONCAT17(cVar3,(undefined7)local_28);
    uVar5 = local_28;
    local_28._3_5_ = SUB85(uVar5,3);
    local_28._0_3_ =
         CONCAT12(bVar10 * '@' + cVar3,
                  CONCAT11(bVar10 >> 2 & 0xf | bVar6 << 4,bVar6 >> 4 & 3 | cVar8 << 2));
    if (uVar12 != 1) {
      uVar7 = 2;
      if (2 < (int)uVar12) {
        uVar7 = uVar12;
      }
      uVar9 = 0;
      do {
        if (pvVar16 < data) {
          pcVar11[(long)pvVar16] = *(char *)((long)&local_28 + uVar9);
          pvVar16 = (void *)((long)pvVar16 + 1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 - 1 != uVar9);
    }
  }
  return (size_t)pvVar16;
}

Assistant:

size_t
    base64_decode(std::string_view encoded_string, void* data, size_t max_size)
{
    auto in_len = encoded_string.size();
    int indexOut = 0;
    int indexIn = 0;
    std::array<unsigned char, 3> char_array_3{{'\0', '\0', '\0'}};
    std::array<unsigned char, 4> char_array_4{{'\0', '\0', '\0', '\0'}};
    auto* outData = static_cast<unsigned char*>(data);
    size_t dataIndex = 0U;
    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];
            if (dataIndex + 2 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                outData[dataIndex++] = char_array_3[2];
            } else if (dataIndex + 1 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                return dataIndex;
            } else if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[0];
                return dataIndex;
            }

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[j];
            }
        }
    }
    return dataIndex;
}